

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::anon_unknown_59::InMemoryDirectory::exists(InMemoryDirectory *this,PathPtr path)

{
  PathPtr path_00;
  Disposer DVar1;
  undefined1 uVar2;
  size_t sVar3;
  char *pcVar4;
  String *pSVar5;
  StringPtr name;
  StringPtr name_00;
  Path newPath;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Array<kj::String> local_50;
  FsNode local_38;
  Disposer local_30;
  
  sVar3 = path.parts.size_;
  pSVar5 = path.parts.ptr;
  if (sVar3 == 0) {
    uVar2 = 1;
  }
  else if (sVar3 == 1) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
               &stack0xffffffffffffffc8,&this->impl);
    if ((pSVar5->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar5->content).ptr;
    }
    name.content.size_ = (size_t)pcVar4;
    name.content.ptr = (char *)local_30._vptr_Disposer;
    Impl::tryGetEntry((Impl *)&local_50,name);
    if ((Clock *)local_50.ptr == (Clock *)0x0) {
      uVar2 = false;
    }
    else {
      uVar2 = true;
      if (*(int *)((long)local_50.ptr + 0x18) == 3) {
        SymlinkNode::parse((Path *)&local_50,(SymlinkNode *)((long)local_50.ptr + 0x20));
        Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
                  ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                   &stack0xffffffffffffffc8);
        path_00.parts.size_ = local_50.size_;
        path_00.parts.ptr = local_50.ptr;
        uVar2 = exists(this,path_00);
        Array<kj::String>::~Array(&local_50);
      }
    }
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
               &stack0xffffffffffffffc8);
  }
  else {
    if ((pSVar5->content).size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pSVar5->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar4;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)&stack0xffffffffffffffc8,name_00);
    DVar1._vptr_Disposer = local_30._vptr_Disposer;
    local_50.ptr = (String *)local_38._vptr_FsNode;
    local_50.size_ = (size_t)local_30._vptr_Disposer;
    local_30._vptr_Disposer = (_func_int **)0x0;
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    if ((Waiter *)DVar1._vptr_Disposer == (Waiter *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (**(code **)(*DVar1._vptr_Disposer + 0x40))(DVar1._vptr_Disposer,pSVar5 + 1,sVar3 - 1)
      ;
    }
    Own<const_kj::ReadableDirectory,_std::nullptr_t>::dispose
              ((Own<const_kj::ReadableDirectory,_std::nullptr_t> *)&local_50);
  }
  return (bool)uVar2;
}

Assistant:

bool exists(PathPtr path) const override {
    if (path.size() == 0) {
      return true;
    } else if (path.size() == 1) {
      auto lock = impl.lockShared();
      KJ_IF_SOME(entry, lock->tryGetEntry(path[0])) {
        return exists(lock, entry);
      } else {
        return false;
      }
    } else {
      KJ_IF_SOME(subdir, tryGetParent(path[0])) {
        return subdir->exists(path.slice(1, path.size()));
      } else {
        return false;
      }
    }
  }